

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_nearest_compute_blob.h
# Opt level: O3

void ncnn::gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
               (Mat *src,Mat *grid,Mat *offset_value,int permute_fusion)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  size_t sVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  void *pvVar12;
  int *piVar13;
  uint uVar14;
  uint uVar18;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar23;
  undefined1 auVar22 [16];
  
  iVar9 = grid->h * grid->w;
  piVar13 = (int *)offset_value->data;
  if (permute_fusion == 0) {
    iVar11 = grid->c;
    if (0 < iVar11) {
      sVar4 = grid->cstep;
      sVar5 = grid->elemsize;
      pvVar12 = grid->data;
      lVar8 = 0;
      do {
        if (0 < iVar9) {
          lVar10 = 0;
          do {
            uVar3 = src->w;
            uVar7 = src->h;
            fVar21 = (float)(int)uVar3;
            fVar23 = (float)(int)uVar7;
            uVar1 = *(undefined8 *)((long)pvVar12 + lVar10 * 4);
            auVar19._0_4_ = (fVar21 - ABS(ABS(((float)uVar1 * 0.5 + 0.5) * fVar21) - fVar21)) + -0.5
            ;
            auVar19._4_4_ =
                 (fVar23 - ABS(ABS(((float)((ulong)uVar1 >> 0x20) * 0.5 + 0.5) * fVar23) - fVar23))
                 + -0.5;
            auVar19._8_8_ = 0;
            auVar20 = maxps(auVar19,ZEXT816(0));
            auVar16._0_4_ = fVar21 + -1.0;
            auVar16._4_4_ = fVar23 + -1.0;
            auVar16._8_8_ = 0;
            auVar16 = minps(auVar16,auVar20);
            fVar21 = floorf(auVar16._0_4_ + 0.5);
            fVar23 = floorf(auVar16._4_4_ + 0.5);
            uVar14 = (uint)fVar21;
            uVar18 = (uint)fVar23;
            iVar11 = (uVar3 * uVar18 + uVar14) * src->elempack;
            auVar20._4_4_ = -(uint)((int)uVar14 < (int)uVar3);
            auVar20._0_4_ = -(uint)((int)uVar14 < (int)uVar3);
            auVar20._8_4_ = -(uint)((int)uVar18 < (int)uVar7);
            auVar20._12_4_ = -(uint)((int)uVar18 < (int)uVar7);
            if ((int)(uVar18 | uVar14) < 0) {
              iVar11 = -1;
            }
            uVar14 = movmskpd(uVar14,auVar20);
            if ((uVar14 & 1) == 0) {
              iVar11 = -1;
            }
            if ((uVar14 & 2) == 0) {
              iVar11 = -1;
            }
            *piVar13 = iVar11;
            piVar13 = piVar13 + 1;
            lVar10 = lVar10 + 2;
          } while ((int)lVar10 < iVar9);
          iVar11 = grid->c;
        }
        lVar8 = lVar8 + 1;
        pvVar12 = (void *)((long)pvVar12 + sVar4 * sVar5);
      } while (lVar8 < iVar11);
    }
  }
  else if (0 < iVar9) {
    pvVar12 = grid->data;
    sVar4 = grid->elemsize;
    sVar5 = grid->cstep;
    lVar8 = 0;
    do {
      uVar2 = src->w;
      uVar6 = src->h;
      fVar21 = (float)(int)uVar2;
      fVar23 = (float)(int)uVar6;
      auVar15._0_4_ =
           (fVar21 - ABS(ABS((*(float *)((long)pvVar12 + lVar8 * 4) * 0.5 + 0.5) * fVar21) - fVar21)
           ) + -0.5;
      auVar15._4_4_ =
           (fVar23 - ABS(ABS((*(float *)((long)pvVar12 + lVar8 * 4 + sVar4 * sVar5) * 0.5 + 0.5) *
                             fVar23) - fVar23)) + -0.5;
      auVar15._8_8_ = 0;
      auVar16 = maxps(auVar15,_DAT_005a3030);
      auVar22._0_4_ = fVar21 + -1.0;
      auVar22._4_4_ = fVar23 + -1.0;
      auVar22._8_8_ = 0;
      auVar16 = minps(auVar22,auVar16);
      fVar21 = floorf(auVar16._0_4_ + 0.5);
      fVar23 = floorf(auVar16._4_4_ + 0.5);
      uVar14 = (uint)fVar21;
      uVar18 = (uint)fVar23;
      iVar11 = (uVar2 * uVar18 + uVar14) * src->elempack;
      auVar17._4_4_ = -(uint)((int)uVar14 < (int)uVar2);
      auVar17._0_4_ = -(uint)((int)uVar14 < (int)uVar2);
      auVar17._8_4_ = -(uint)((int)uVar18 < (int)uVar6);
      auVar17._12_4_ = -(uint)((int)uVar18 < (int)uVar6);
      if ((int)(uVar18 | uVar14) < 0) {
        iVar11 = -1;
      }
      uVar14 = movmskpd(uVar14,auVar17);
      if ((uVar14 & 1) == 0) {
        iVar11 = -1;
      }
      if ((uVar14 & 2) == 0) {
        iVar11 = -1;
      }
      piVar13[lVar8] = iVar11;
      lVar8 = lVar8 + 1;
    } while (iVar9 != (int)lVar8);
  }
  return;
}

Assistant:

void gridsample_2d_nearest_compute_blob(const Mat& src, const Mat& grid, Mat& offset_value, int permute_fusion)
{
    const int grid_size = grid.w * grid.h;

    float* offset_ptr = offset_value.channel(0);

    grid_sample_unormalize<align_corner> unormalize;
    compute_coord<pd, align_corner> get_coord;

    if (permute_fusion == 0)
    {
        for (int y = 0; y < grid.c; y++)
        {
            const float* gridptr = grid.channel(y);
            int x = 0;
#if __AVX__
            for (; x + 15 < grid_size; x += 16)
            {
                __m256 gx = _mm256_loadu_ps(gridptr);
                __m256 gy = _mm256_loadu_ps(gridptr + 8);

                transpose2x8_ps(gx, gy);

                gx = unormalize(_mm256_set1_ps(src.w), gx);
                gx = get_coord(_mm256_set1_ps(src.w), gx);

                gy = unormalize(_mm256_set1_ps(src.h), gy);
                gy = get_coord(_mm256_set1_ps(src.h), gy);

                gx = _mm256_floor_ps(_mm256_add_ps(gx, _mm256_set1_ps(0.5f)));
                gy = _mm256_floor_ps(_mm256_add_ps(gy, _mm256_set1_ps(0.5f)));

                __m256 v_in_range = _mm256_and_ps(_mm256_and_ps(_mm256_cmp_ps(gx, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx, _CMP_GT_OS)),
                                                  _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS)));

                __m256 offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(gy, _mm256_set1_ps(src.w), gx), _mm256_set1_ps(src.elempack));

                offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), _mm256_castsi256_ps(_mm256_cvtps_epi32(offset)), v_in_range);

                _mm256_storeu_ps(offset_ptr, offset);

                gridptr += 16;
                offset_ptr += 8;
            }

#endif // __AVX__

            for (; x < grid_size; x += 2)
            {
                float sample_x = *gridptr;
                float sample_y = *(gridptr + 1);

                sample_x = unormalize(src.w, sample_x);
                sample_x = get_coord(src.w, sample_x);

                sample_y = unormalize(src.h, sample_y);
                sample_y = get_coord(src.h, sample_y);

                int x0 = static_cast<int>(floorf(sample_x + 0.5f));
                int y0 = static_cast<int>(floorf(sample_y + 0.5f));

                bool in_bound = ((x0 > -1) & (x0 < src.w) & (y0 > -1) & (y0 < src.h));

                int* iptr = (int*)offset_ptr;
                *iptr = in_bound ? (x0 + y0 * src.w) * src.elempack : -1.0;

                gridptr += 2;
                offset_ptr++;
            }
        }
    }
    else
    {
        const float* gridptr_x = grid.channel(0);
        const float* gridptr_y = grid.channel(1);

        int x = 0;
#if __AVX__
        for (; x + 7 < grid_size; x += 8)
        {
            __m256 gx = _mm256_loadu_ps(gridptr_x);
            __m256 gy = _mm256_loadu_ps(gridptr_y);

            gx = unormalize(_mm256_set1_ps(src.w), gx);
            gx = get_coord(_mm256_set1_ps(src.w), gx);

            gy = unormalize(_mm256_set1_ps(src.h), gy);
            gy = get_coord(_mm256_set1_ps(src.h), gy);

            gx = _mm256_floor_ps(_mm256_add_ps(gx, _mm256_set1_ps(0.5f)));
            gy = _mm256_floor_ps(_mm256_add_ps(gy, _mm256_set1_ps(0.5f)));

            __m256 v_in_range = _mm256_and_ps(_mm256_and_ps(_mm256_cmp_ps(gx, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx, _CMP_GT_OS)),
                                              _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS)));

            __m256 offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(gy, _mm256_set1_ps(src.w), gx), _mm256_set1_ps(src.elempack));

            offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), _mm256_castsi256_ps(_mm256_cvtps_epi32(offset)), v_in_range);

            _mm256_storeu_ps(offset_ptr, offset);

            gridptr_x += 8;
            gridptr_y += 8;
            offset_ptr += 8;
        }

#endif // __AVX__

        for (; x < grid_size; x++)
        {
            float sample_x = *gridptr_x;
            float sample_y = *gridptr_y;

            sample_x = unormalize(src.w, sample_x);
            sample_x = get_coord(src.w, sample_x);

            sample_y = unormalize(src.h, sample_y);
            sample_y = get_coord(src.h, sample_y);

            int x0 = static_cast<int>(floorf(sample_x + 0.5f));
            int y0 = static_cast<int>(floorf(sample_y + 0.5f));

            bool in_bound = ((x0 > -1) & (x0 < src.w) & (y0 > -1) & (y0 < src.h));

            int* iptr = (int*)offset_ptr;
            *iptr = in_bound ? (x0 + y0 * src.w) * src.elempack : -1.0;

            gridptr_x++;
            gridptr_y++;

            offset_ptr++;
        }
    }
}